

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_sse_blend_popcnt_unroll4(uint16_t *array,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  
  auVar3 = _DAT_00116070;
  auVar2 = _DAT_00116060;
  if (len < 0x20) {
    uVar6 = 0;
  }
  else {
    uVar5 = 0;
    uVar4 = 4;
    do {
      uVar6 = uVar4;
      auVar10 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8),auVar2,
                                  *(undefined1 (*) [16])(array + uVar5 * 8 + 8));
      auVar11 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 8),auVar3,
                                  *(undefined1 (*) [16])(array + uVar5 * 8));
      auVar8 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 0x10),auVar2,
                                 *(undefined1 (*) [16])(array + uVar5 * 8 + 0x18));
      auVar9 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 0x18),auVar3,
                                 *(undefined1 (*) [16])(array + uVar5 * 8 + 0x10));
      lVar7 = 0x20;
      do {
        *(int *)((long)flags + lVar7 + -4) =
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar8[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar10[0xf] >> 7) << 0xf)) +
             *(int *)((long)flags + lVar7 + -4);
        *(int *)((long)flags + lVar7 + 0x1c) =
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar9[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf)) +
             *(int *)((long)flags + lVar7 + 0x1c);
        auVar10 = vpaddb_avx(auVar10,auVar10);
        auVar11 = vpaddb_avx(auVar11,auVar11);
        auVar8 = vpaddb_avx(auVar8,auVar8);
        auVar9 = vpaddb_avx(auVar9,auVar9);
        lVar7 = lVar7 + -4;
      } while (lVar7 != 0);
      uVar5 = uVar6;
      uVar4 = uVar6 + 4;
    } while (uVar6 + 4 <= (ulong)(len >> 3));
  }
  auVar3 = _DAT_00116070;
  auVar2 = _DAT_00116060;
  uVar5 = uVar6 | 2;
  while (uVar4 = uVar5, uVar4 <= len >> 3) {
    auVar10 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar6 * 8),auVar2,
                                *(undefined1 (*) [16])(array + uVar6 * 8 + 8));
    auVar11 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar6 * 8 + 8),auVar3,
                                *(undefined1 (*) [16])(array + uVar6 * 8));
    lVar7 = 0x20;
    do {
      piVar1 = (int *)((long)flags + lVar7 + -4);
      *piVar1 = *piVar1 + POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                                  (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                                  (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                                                 (ushort)(byte)(auVar10[0xf] >> 7) << 0xf));
      piVar1 = (int *)((long)flags + lVar7 + 0x1c);
      *piVar1 = *piVar1 + POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                                                  (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                                                  (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                                                 (ushort)(byte)(auVar11[0xf] >> 7) << 0xf));
      auVar10 = vpaddb_avx(auVar10,auVar10);
      auVar11 = vpaddb_avx(auVar11,auVar11);
      lVar7 = lVar7 + -4;
    } while (lVar7 != 0);
    uVar6 = uVar4;
    uVar5 = uVar4 + 2;
  }
  uVar6 = uVar6 << 3;
  if (uVar6 < len) {
    auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar13 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar15 = vpbroadcastd_avx512f();
      auVar15 = vpsrlvd_avx512f(auVar15,auVar13);
      auVar15 = vpandd_avx512f(auVar15,auVar14);
      auVar12 = vpaddd_avx512f(auVar15,auVar12);
      uVar6 = uVar6 + 1;
    } while (len != uVar6);
    auVar12 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])flags = auVar12;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_blend_popcnt_unroll4(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m128i* data_vectors = (const __m128i*)(array);
    const uint32_t n_cycles = len / 8;

    size_t i = 0;
    for (/**/; i + 4 <= n_cycles; i += 4) {
#define L(p) __m128i v##p =  _mm_loadu_si128(data_vectors+i+p);
        L(0) L(1) L(2) L(3)

#define U0(p,k) __m128i input##p = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16(0x00FF)), _mm_slli_epi16(v##k, 8));
#define U1(p,k) __m128i input##k = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16((int16_t)0xFF00)), _mm_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3)

#define P0(p) input##p = _mm_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 8;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}